

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chameleon-core.cpp
# Opt level: O2

double * read2d(char *charfilename,char *charplane)

{
  long lVar1;
  bool bVar2;
  mapped_type *pmVar3;
  ostream *poVar4;
  istream *piVar5;
  double *pdVar6;
  void *pvVar7;
  ulong uVar8;
  double *pdVar9;
  long j;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  allocator local_2c9;
  void *local_2c8;
  ulong local_2c0;
  ulong local_2b8;
  key_type local_2b0;
  long local_290;
  ulong local_288;
  string plane;
  string filename;
  fstream fs;
  byte abStack_220 [496];
  
  std::__cxx11::string::string((string *)&filename,charfilename,(allocator *)&fs);
  std::__cxx11::string::string((string *)&plane,charplane,(allocator *)&fs);
  std::__cxx11::string::string((string *)&fs,"nx",(allocator *)&local_2b0);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
           ::operator[](&conf_abi_cxx11_,(key_type *)&fs);
  uVar12 = (ulong)*pmVar3;
  std::__cxx11::string::~string((string *)&fs);
  std::__cxx11::string::string((string *)&fs,"ny",(allocator *)&local_2b0);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
           ::operator[](&conf_abi_cxx11_,(key_type *)&fs);
  uVar11 = (ulong)*pmVar3;
  std::__cxx11::string::~string((string *)&fs);
  std::__cxx11::string::string((string *)&fs,"nz",(allocator *)&local_2b0);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
           ::operator[](&conf_abi_cxx11_,(key_type *)&fs);
  uVar14 = (ulong)*pmVar3;
  std::__cxx11::string::~string((string *)&fs);
  std::fstream::fstream(&fs,(string *)&filename,_S_in);
  if ((abStack_220[*(long *)(_fs + -0x18)] & 5) == 0) {
    std::__cxx11::string::string((string *)&local_2b0,"output_mode",&local_2c9);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
             ::operator[](&conf_abi_cxx11_,&local_2b0);
    local_2c8 = (void *)*pmVar3;
    lVar1 = uVar14 + uVar11;
    local_288 = uVar14 * uVar11;
    local_290 = lVar1 * uVar12;
    uVar10 = local_290 + local_288;
    std::__cxx11::string::~string((string *)&local_2b0);
    if (((double)local_2c8 != 0.0) || (NAN((double)local_2c8))) {
      std::__cxx11::string::string((string *)&local_2b0,"output_mode",&local_2c9);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
               ::operator[](&conf_abi_cxx11_,&local_2b0);
      local_2c8 = (void *)*pmVar3;
      std::__cxx11::string::~string((string *)&local_2b0);
      if (((double)local_2c8 != 1.0) || (NAN((double)local_2c8))) {
        poVar4 = std::operator<<((ostream *)&std::cerr,
                                 "libchameleon: read:: ERROR: unknown output_mode");
        goto LAB_00103978;
      }
      std::fstream::close();
      std::fstream::open((string *)&fs,(_Ios_Openmode)&filename);
      uVar8 = uVar10 * 8;
      if (0x1fffffffffffffff < uVar10) {
        uVar8 = 0xffffffffffffffff;
      }
      local_2c8 = operator_new__(uVar8);
      std::istream::read((char *)&fs,(long)local_2c8);
    }
    else {
      uVar8 = uVar10 * 8;
      if (0x1fffffffffffffff < uVar10) {
        uVar8 = 0xffffffffffffffff;
      }
      local_2c8 = operator_new__(uVar8);
      lVar13 = 0;
      local_2c0 = uVar12;
      local_2b8 = uVar14;
      do {
        piVar5 = std::istream::_M_extract<double>((double *)&fs);
        uVar12 = local_2c0;
        uVar14 = local_2b8;
        if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
        bVar2 = lVar13 < (long)uVar10;
        lVar13 = lVar13 + 1;
      } while (bVar2);
    }
    std::fstream::close();
    bVar2 = std::operator==(&plane,"xy");
    if (bVar2) {
      uVar14 = uVar11 * uVar12 * 8;
      if (0x1fffffffffffffff < uVar11 * uVar12) {
        uVar14 = 0xffffffffffffffff;
      }
      pdVar6 = (double *)operator_new__(uVar14);
      pvVar7 = local_2c8;
      pdVar9 = pdVar6;
      for (uVar14 = 0; uVar14 != (~((long)uVar12 >> 0x3f) & uVar12); uVar14 = uVar14 + 1) {
        for (uVar10 = 0; (~((long)uVar11 >> 0x3f) & uVar11) != uVar10; uVar10 = uVar10 + 1) {
          pdVar9[uVar10] = *(double *)((long)pvVar7 + uVar10 * 8);
        }
        pdVar9 = pdVar9 + uVar11;
        pvVar7 = (void *)((long)pvVar7 + lVar1 * 8);
      }
    }
    else {
      bVar2 = std::operator==(&plane,"xz");
      if (bVar2) {
        uVar10 = uVar14 * uVar12 * 8;
        if (0x1fffffffffffffff < uVar14 * uVar12) {
          uVar10 = 0xffffffffffffffff;
        }
        pdVar6 = (double *)operator_new__(uVar10);
        pvVar7 = (void *)((long)local_2c8 + uVar11 * 8);
        pdVar9 = pdVar6;
        for (uVar11 = 0; uVar11 != (~((long)uVar12 >> 0x3f) & uVar12); uVar11 = uVar11 + 1) {
          for (uVar10 = 0; (~((long)uVar14 >> 0x3f) & uVar14) != uVar10; uVar10 = uVar10 + 1) {
            pdVar9[uVar10] = *(double *)((long)pvVar7 + uVar10 * 8);
          }
          pdVar9 = pdVar9 + uVar14;
          pvVar7 = (void *)((long)pvVar7 + lVar1 * 8);
        }
      }
      else {
        bVar2 = std::operator==(&plane,"yz");
        if (bVar2) {
          uVar12 = local_288 * 8;
          if (0x1fffffffffffffff < local_288) {
            uVar12 = 0xffffffffffffffff;
          }
          pdVar6 = (double *)operator_new__(uVar12);
          pvVar7 = (void *)((long)local_2c8 + local_290 * 8);
          pdVar9 = pdVar6;
          for (uVar12 = 0; uVar12 != (~((long)uVar11 >> 0x3f) & uVar11); uVar12 = uVar12 + 1) {
            for (uVar10 = 0; (~((long)uVar14 >> 0x3f) & uVar14) != uVar10; uVar10 = uVar10 + 1) {
              pdVar9[uVar10] = *(double *)((long)pvVar7 + uVar10 * 8);
            }
            pdVar9 = pdVar9 + uVar14;
            pvVar7 = (void *)((long)pvVar7 + uVar14 * 8);
          }
        }
        else {
          poVar4 = std::operator<<((ostream *)&std::cerr,
                                   "libchameleon: read: possible plane values are xy, xz and yz,given: "
                                  );
          poVar4 = std::operator<<(poVar4,(string *)&plane);
          std::endl<char,std::char_traits<char>>(poVar4);
          pdVar6 = (double *)0x0;
        }
      }
    }
    operator_delete__(local_2c8);
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cerr,"libchameleon: read: ERROR: no such file, ");
    poVar4 = std::operator<<(poVar4,(string *)&filename);
LAB_00103978:
    std::endl<char,std::char_traits<char>>(poVar4);
    pdVar6 = (double *)0x0;
  }
  std::fstream::~fstream(&fs);
  std::__cxx11::string::~string((string *)&plane);
  std::__cxx11::string::~string((string *)&filename);
  return pdVar6;
}

Assistant:

double* read2d(const char* charfilename, const char* charplane) {
    string filename(charfilename);
    string plane(charplane);
    long nx = conf["nx"];
    long ny = conf["ny"];
    long nz = conf["nz"];
    long n = nx * (ny + nz) + ny * nz;
    double* a;
    fstream fs(filename, ios_base::in);
    if (fs) {
        if (conf["output_mode"] == 0) {
            // text mode
            a = new double[n];
            long i = 0;
            while (fs >> a[i] && i < n)
                ++i;
        } else if (conf["output_mode"] == 1) {
            // binary mode
            fs.close();
            fs.open(filename, ios_base::in | ios_base::binary);
            a = new double[n];
            fs.read(reinterpret_cast<char*>(a), sizeof(double) * n);
        } else {
            cerr << "libchameleon: read:: ERROR: unknown output_mode" << endl;
            return nullptr;
        }
    } else {
        cerr << "libchameleon: read: ERROR: no such file, " << filename <<
            endl;
        return nullptr;
    }
    fs.close();
    double* b;
    if (plane == "xy") {
        b = new double[nx * ny];
        for (long i = 0; i < nx; ++i)
            for (long j = 0; j < ny; ++j)
                b[i * ny + j] = a[i * (ny + nz) + j];
    } else if (plane == "xz") {
        b = new double[nx * nz];
        for (long i = 0; i < nx; ++i)
            for (long j = 0; j < nz; ++j)
                b[i * nz + j] = a[i * (ny + nz) + ny + j];
    } else if (plane == "yz") {
        b = new double[ny * nz];
        for (long i = 0; i < ny; ++i)
            for (long j = 0; j < nz; ++j)
                b[i * nz + j] = a[nx * (ny + nz) + i * nz + j];
    } else {
        cerr << "libchameleon: read: possible plane values are xy, xz and yz,"
            "given: " << plane << endl;
        delete[] a;
        return nullptr;
    }
    delete[] a;
    return b;
}